

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void output(string *outputFile)

{
  uint __val;
  long *__s;
  FILE *__s_00;
  long *plVar1;
  size_t __size;
  uint uVar2;
  ulong uVar3;
  long *plVar4;
  uint uVar5;
  uint __len;
  int *piVar6;
  long lVar7;
  string __str;
  long *local_70 [2];
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  __s_00 = fopen((outputFile->_M_dataplus)._M_p,"w");
  __val = -ansNum;
  if (0 < ansNum) {
    __val = ansNum;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar5 = 4;
    do {
      __len = uVar5;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_00102de0;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_00102de0;
      }
      if (uVar2 < 10000) goto LAB_00102de0;
      uVar3 = uVar3 / 10000;
      uVar5 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_00102de0:
  uVar5 = (uint)ansNum >> 0x1f;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct((ulong)local_70,(char)__len - (char)(ansNum >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_70[0] + (ulong)uVar5),__len,__val);
  plVar1 = (long *)std::__cxx11::string::append((char *)local_70);
  plVar4 = plVar1 + 2;
  if ((long *)*plVar1 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar1[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar1;
  }
  __s = local_50;
  local_48 = plVar1[1];
  *plVar1 = (long)plVar4;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  __size = strlen((char *)__s);
  fwrite(__s,__size,1,__s_00);
  piVar6 = cycleNum + 3;
  lVar7 = 0;
  do {
    fwrite(*(void **)((long)cycle + lVar7),(long)*piVar6,1,__s_00);
    lVar7 = lVar7 + 8;
    piVar6 = piVar6 + 1;
  } while (lVar7 != 0x28);
  fclose(__s_00);
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}